

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O0

int __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::autoHashSize
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int middle;
  int right;
  int left;
  int oldsize;
  int local_1c;
  int local_18;
  
  iVar1 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
          ::size((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                  *)0x19fcb7);
  local_18 = 0;
  local_1c = *(int *)(in_RDI + 0xf8) + -1;
  while( true ) {
    while( true ) {
      if (local_1c < local_18) {
        return *(int *)(in_RDI + 0x30 + (long)local_18 * 4);
      }
      iVar2 = (local_18 + local_1c) / 2;
      if (*(int *)(in_RDI + 0x30 + (long)iVar2 * 4) <= iVar1) break;
      local_1c = iVar2 + -1;
    }
    if (iVar1 <= *(int *)(in_RDI + 0x30 + (long)iVar2 * 4)) break;
    local_18 = iVar2 + 1;
  }
  return *(int *)(in_RDI + 0x30 + (long)(iVar2 + 1) * 4);
}

Assistant:

int autoHashSize() const
   {
      auto oldsize = m_elem.size();

      int left = 0;
      int right = nprimes - 1;
      int middle;

      while(left <= right)
      {
         middle = (left + right) / 2;

         if(oldsize < primes[middle])
         {
            right = middle - 1;
         }
         else if(oldsize > primes[middle])
         {
            left = middle + 1;
         }
         else
         {
            assert(oldsize == primes[middle]);
            return primes[middle + 1];
         }
      }

      assert(left == right + 1);
      return primes[left];
   }